

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzer.cpp
# Opt level: O1

void __thiscall SimpleParallelAnalyzer::SetupResults(SimpleParallelAnalyzer *this)

{
  SimpleParallelAnalyzerResults *pSVar1;
  SimpleParallelAnalyzerResults *this_00;
  
  this_00 = (SimpleParallelAnalyzerResults *)operator_new(0x20);
  SimpleParallelAnalyzerResults::SimpleParallelAnalyzerResults
            (this_00,this,(this->mSettings)._M_ptr);
  pSVar1 = (this->mResults)._M_ptr;
  if (pSVar1 != this_00) {
    if (pSVar1 != (SimpleParallelAnalyzerResults *)0x0) {
      (**(code **)(*(long *)pSVar1 + 8))();
    }
    (this->mResults)._M_ptr = this_00;
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void SimpleParallelAnalyzer::SetupResults()
{
	mResults.reset( new SimpleParallelAnalyzerResults( this, mSettings.get() ) );
	SetAnalyzerResults( mResults.get() );

	//this is the channel where the BubbleText (the analyzer output values) will show up in the
	//waveform window
	mResults->AddChannelBubblesWillAppearOn( mSettings->mClockChannel );
}